

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap64::SetHeapBlockNoCheck
          (HeapBlockMap64 *this,void *address,size_t pageCount,HeapBlock *heapBlock,
          HeapBlockType blockType,byte bucketIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  ulong uVar5;
  Node *pNVar6;
  ulong uVar7;
  
  uVar4 = 0x100000 - ((uint)((ulong)address >> 0xc) & 0xfffff);
  uVar7 = pageCount & 0xffffffff;
  if (uVar4 <= pageCount) {
    uVar7 = (ulong)uVar4;
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    uVar4 = (uint)uVar7;
    for (pNVar6 = this->list; pNVar6 != (Node *)0x0; pNVar6 = pNVar6->next) {
      if (pNVar6->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_006bff9b;
    }
    pNVar6 = (Node *)0x0;
LAB_006bff9b:
    if (pNVar6 == (Node *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x4dc,"(node != nullptr)","node != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    HeapBlockMap32::SetHeapBlockNoCheck(&pNVar6->map,address,uVar4,heapBlock,blockType,bucketIndex);
    pageCount = pageCount - uVar7;
    uVar5 = 0x100000;
    if (pageCount < 0x100000) {
      uVar5 = pageCount;
    }
    if (pageCount != 0) {
      address = (void *)(uVar7 * 0x1000 + (long)address);
      uVar4 = (uint)uVar5;
    }
    uVar7 = (ulong)uVar4;
    if (pageCount == 0) {
      return;
    }
  } while( true );
}

Assistant:

void
HeapBlockMap64::SetHeapBlockNoCheck(void * address, size_t pageCount, HeapBlock * heapBlock, HeapBlock::HeapBlockType blockType, byte bucketIndex)
{
    ForEachNodeInAddressRange(address, pageCount, [&](Node * node, void * address, uint nodePages)
    {
        Assert(node != nullptr);
        node->map.SetHeapBlockNoCheck(address, nodePages, heapBlock, blockType, bucketIndex);
    });
}